

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

void prepare_default_pairs(vrna_md_t *md)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int (*paiVar7) [21];
  size_t sVar8;
  uint uVar9;
  ulong uVar10;
  
  lVar6 = 0;
  do {
    md->alias[lVar6] = (short)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  md->alias[5] = 3;
  md->alias[6] = 2;
  md->alias[7] = 0;
  paiVar7 = md->pair;
  lVar6 = 0;
  do {
    uVar1 = *(undefined8 *)((long)BP_pair[0] + lVar6);
    uVar2 = *(undefined8 *)((long)BP_pair[0] + lVar6 + 8);
    uVar3 = *(undefined8 *)((long)BP_pair[0] + lVar6 + 0x18);
    *(undefined8 *)(*paiVar7 + 4) = *(undefined8 *)((long)BP_pair[0] + lVar6 + 0x10);
    *(undefined8 *)(*paiVar7 + 6) = uVar3;
    *(undefined8 *)*paiVar7 = uVar1;
    *(undefined8 *)(*paiVar7 + 2) = uVar2;
    lVar6 = lVar6 + 0x20;
    paiVar7 = paiVar7 + 1;
  } while (lVar6 != 0x100);
  if (md->noGU != 0) {
    md->pair[4][3] = 0;
    md->pair[3][4] = 0;
  }
  if ((md->nonstandards[0] != '\0') && (md->nonstandards[0] != '\0')) {
    uVar9 = 2;
    uVar10 = 0;
    do {
      iVar4 = vrna_nucleotide_encode(md->nonstandards[uVar10],md);
      iVar5 = vrna_nucleotide_encode(md->nonstandards[uVar9 - 1],md);
      md->pair[iVar4][iVar5] = 7;
      uVar10 = (ulong)uVar9;
      sVar8 = strlen(md->nonstandards);
      uVar9 = uVar9 + 2;
    } while (uVar10 < sVar8);
  }
  return;
}

Assistant:

PRIVATE void
prepare_default_pairs(vrna_md_t *md)
{
  unsigned int i, j;

  for (i = 0; i < 5; i++)
    md->alias[i] = (short)i;

  md->alias[5]  = 3;          /* X <-> G */
  md->alias[6]  = 2;          /* K <-> C */
  md->alias[7]  = 0;          /* I <-> default base '@' */

  for (i = 0; i < NBASES; i++)
    for (j = 0; j < NBASES; j++)
      md->pair[i][j] = BP_pair[i][j];

  if (md->noGU)
    md->pair[3][4] = md->pair[4][3] = 0;

  if (md->nonstandards[0] != '\0') {
    /* allow nonstandard bp's (encoded by type=7) */
    for (i = 0; i < strlen(md->nonstandards); i += 2)
      md->pair[vrna_nucleotide_encode(md->nonstandards[i], md)]
      [vrna_nucleotide_encode(md->nonstandards[i + 1], md)] = 7;
  }
}